

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-el.cpp
# Opt level: O3

void __thiscall IntVarEL::initBLits(IntVarEL *this)

{
  return;
}

Assistant:

void IntVarEL::initBLits() {
	if (base_blit != INT_MIN) {
		return;
	}
	if (lit_min == INT_MIN) {
		lit_min = min;
		lit_max = max;
	}
	base_blit = 2 * (sat.nVars() - lit_min) + 1;
	sat.newVar(lit_max - lit_min + 2, ChannelInfo(var_id, 1, 1, lit_min - 1));
	for (int i = lit_min; i <= min; i++) {
		sat.cEnqueue(getGELit(i), nullptr);
	}
	for (int i = max; i <= lit_max; i++) {
		sat.cEnqueue(getLELit(i), nullptr);
	}
}